

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O3

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RestrictLastObjVal
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  long lVar1;
  double dVar2;
  Type TVar3;
  int expr;
  pointer pQVar4;
  long lVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  LinTerms *pLVar7;
  SmallVec<int,_6> *pSVar8;
  double dVar9;
  NodeRange NVar10;
  AlgConRange rng;
  AlgConRange rng_00;
  undefined1 local_e88 [72];
  ptr local_e40;
  ulong local_e38;
  undefined1 local_e10 [72];
  ptr local_dc8;
  ulong local_dc0;
  undefined1 local_d98 [72];
  ptr local_d50;
  ulong local_d48;
  undefined1 local_d20 [72];
  ptr local_cd8;
  ulong local_cd0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_ca8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_c08;
  NLConstraint local_b68;
  NLConstraint local_a98;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_9c8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> local_7e8;
  QuadTerms local_608;
  QuadTerms local_4c8;
  QuadAndLinTerms local_388;
  QuadAndLinTerms local_1d0;
  
  lVar5 = (long)this->i_current_obj_;
  lVar1 = lVar5 + -1;
  pQVar4 = (this->obj_new_).
           super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar9 = ABS(this->objval_last_) *
          (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 + -1];
  dVar2 = (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 + -1];
  if (dVar9 <= dVar2) {
    dVar9 = dVar2;
  }
  TVar3 = pQVar4[lVar1].super_NLObjective.super_LinearObjective.sense_;
  expr = pQVar4[lVar1].super_NLObjective.expr_;
  rng_00.ub_ = dVar9 * *(double *)(&DAT_0037d120 + (ulong)(TVar3 == MAX) * 8) + this->objval_last_;
  if (expr < 0) {
    if (*(size_ty *)
         ((long)&pQVar4[lVar1].qt_.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
         + 0x10) == 0) {
      pLVar7 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
      pSVar8 = (SmallVec<int,_6> *)
               ((long)&pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_ + 0x48);
      if (TVar3 == MAX) {
        gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<double>,6u> *)local_e10,pLVar7);
        gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<int>,6u> *)&local_dc8,pSVar8);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  (&local_c08,(LinTerms *)local_e10,rng_00.ub_,true);
        NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                 ::
                 AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                           ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                             *)&this[-5].obj_new_tolr_,&local_c08);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)&this[-5].obj_new_tolr_,NVar10);
        if (6 < local_c08.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_c08.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_c08.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_c08.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_c08.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_c08.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c08.super_BasicConstraint.name_._M_dataplus._M_p !=
            &local_c08.super_BasicConstraint.name_.field_2) {
          operator_delete(local_c08.super_BasicConstraint.name_._M_dataplus._M_p,
                          local_c08.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
        }
        local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_e10._0_8_;
        local_e88._8_8_ = local_e10._8_8_;
        if (6 < local_dc0) {
          operator_delete(local_dc8,local_dc0 << 2);
          local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_e10._0_8_;
          local_e88._8_8_ = local_e10._8_8_;
        }
      }
      else {
        gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<double>,6u> *)local_e88,pLVar7);
        gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<int>,6u> *)&local_e40,pSVar8);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (&local_ca8,(LinTerms *)local_e88,(AlgConRhs<_1>)rng_00.ub_,true);
        NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                 ::
                 AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                           ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                             *)&this[-5].obj_new_tolr_,&local_ca8);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)&this[-5].obj_new_tolr_,NVar10);
        if (6 < local_ca8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_ca8.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_ca8.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_ca8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_ca8.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_ca8.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ca8.super_BasicConstraint.name_._M_dataplus._M_p !=
            &local_ca8.super_BasicConstraint.name_.field_2) {
          operator_delete(local_ca8.super_BasicConstraint.name_._M_dataplus._M_p,
                          local_ca8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
        }
        local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_e88._0_8_;
        if (6 < local_e38) {
          operator_delete(local_e40,local_e38 << 2);
          local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_e88._0_8_;
        }
      }
    }
    else {
      pvVar6 = &this[-5].obj_new_tolr_;
      pLVar7 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
      pSVar8 = (SmallVec<int,_6> *)
               ((long)&pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_ + 0x48);
      if (TVar3 == MAX) {
        gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<double>,6u> *)local_d20,pLVar7);
        gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<int>,6u> *)&local_cd8,pSVar8);
        QuadTerms::QuadTerms(&local_4c8,&pQVar4[lVar1].qt_);
        QuadAndLinTerms::QuadAndLinTerms(&local_1d0,(LinTerms *)local_d20,&local_4c8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  (&local_7e8,&local_1d0,rng_00.ub_,true);
        NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                 ::
                 AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                           ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                             *)pvVar6,&local_7e8);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)pvVar6,NVar10);
        if (6 < local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_7e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (8 < local_7e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        if (6 < local_7e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_7e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_7e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_7e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8.super_BasicConstraint.name_._M_dataplus._M_p !=
            &local_7e8.super_BasicConstraint.name_.field_2) {
          operator_delete(local_7e8.super_BasicConstraint.name_._M_dataplus._M_p,
                          local_7e8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
        }
        if (6 < local_1d0.super_QuadTerms.vars2_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_1d0.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_1d0.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_1d0.super_QuadTerms.vars1_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_1d0.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_1d0.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_1d0.super_QuadTerms.coefs_aux_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_1d0.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_1d0.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (8 < local_1d0.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_1d0.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_1d0.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        if (6 < local_1d0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_1d0.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_1d0.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_1d0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_1d0.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_1d0.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (6 < local_4c8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_4c8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_4c8.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_4c8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_4c8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_4c8.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_4c8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_4c8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_4c8.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity <<
                          3);
        }
        if (8 < local_4c8.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_4c8.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_4c8.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_d20._0_8_;
        local_e88._8_8_ = local_d20._8_8_;
        if (6 < local_cd0) {
          operator_delete(local_cd8,local_cd0 << 2);
          local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_d20._0_8_;
          local_e88._8_8_ = local_d20._8_8_;
        }
      }
      else {
        gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<double>,6u> *)local_d98,pLVar7);
        gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                  ((small_vector_base<std::allocator<int>,6u> *)&local_d50,pSVar8);
        QuadTerms::QuadTerms(&local_608,&pQVar4[lVar1].qt_);
        QuadAndLinTerms::QuadAndLinTerms(&local_388,(LinTerms *)local_d98,&local_608);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (&local_9c8,&local_388,(AlgConRhs<_1>)rng_00.ub_,true);
        NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                 ::
                 AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                           ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                             *)pvVar6,&local_9c8);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)pvVar6,NVar10);
        if (6 < local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_9c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (8 < local_9c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        if (6 < local_9c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_9c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_9c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_9c8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9c8.super_BasicConstraint.name_._M_dataplus._M_p !=
            &local_9c8.super_BasicConstraint.name_.field_2) {
          operator_delete(local_9c8.super_BasicConstraint.name_._M_dataplus._M_p,
                          local_9c8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
        }
        if (6 < local_388.super_QuadTerms.vars2_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_388.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_388.super_QuadTerms.vars2_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_388.super_QuadTerms.vars1_aux_.
                super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_388.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_388.super_QuadTerms.vars1_aux_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_388.super_QuadTerms.coefs_aux_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_388.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_388.super_QuadTerms.coefs_aux_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (8 < local_388.super_QuadTerms.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_388.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_388.super_QuadTerms.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        if (6 < local_388.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_388.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_388.super_LinTerms.vars_.
                          super_small_vector_base<std::allocator<int>,_6U>.m_data.
                          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
        }
        if (6 < local_388.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_388.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_388.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
        }
        if (6 < local_608.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_608.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_608.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_608.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_608.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_608.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_608.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_608.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_608.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity <<
                          3);
        }
        if (8 < local_608.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_608.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_608.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
        local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_d98._0_8_;
        local_e88._8_8_ = local_d98._8_8_;
        if (6 < local_d48) {
          operator_delete(local_d50,local_d48 << 2);
          local_b68.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_d98._0_8_;
          local_e88._8_8_ = local_d98._8_8_;
        }
      }
    }
    if ((ulong)local_e88._8_8_ < 7) {
      return;
    }
    local_e88._8_8_ = local_e88._8_8_ << 3;
  }
  else {
    pvVar6 = &this[-5].obj_new_tolr_;
    pLVar7 = &pQVar4[lVar1].super_NLObjective.super_LinearObjective.lt_;
    if (TVar3 == MAX) {
      rng.ub_ = INFINITY;
      rng.lb_ = rng_00.ub_;
      NLConstraint::NLConstraint(&local_a98,pLVar7,expr,rng,true);
      NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)pvVar6,&local_a98);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)pvVar6,NVar10);
      if (6 < local_a98.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
              m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a98.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_a98.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_a98.lcr_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_a98.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_a98.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98.lcr_.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_a98.lcr_.super_BasicConstraint.name_.field_2) {
        operator_delete(local_a98.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_a98.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1
                       );
      }
      local_b68.super_BasicConstraint.name_.field_2._M_allocated_capacity =
           local_a98.super_BasicConstraint.name_.field_2._M_allocated_capacity;
      local_b68.super_BasicConstraint.name_._M_dataplus._M_p =
           local_a98.super_BasicConstraint.name_._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98.super_BasicConstraint.name_._M_dataplus._M_p ==
          &local_a98.super_BasicConstraint.name_.field_2) {
        return;
      }
    }
    else {
      rng_00.lb_ = -INFINITY;
      NLConstraint::NLConstraint(&local_b68,pLVar7,expr,rng_00,true);
      NVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)pvVar6,&local_b68);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)pvVar6,NVar10);
      if (6 < local_b68.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
              m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_b68.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_b68.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_b68.lcr_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_b68.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_b68.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b68.lcr_.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_b68.lcr_.super_BasicConstraint.name_.field_2) {
        operator_delete(local_b68.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_b68.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b68.super_BasicConstraint.name_._M_dataplus._M_p ==
          &local_b68.super_BasicConstraint.name_.field_2) {
        return;
      }
    }
    local_e88._8_8_ = local_b68.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1;
  }
  operator_delete(local_b68.super_BasicConstraint.name_._M_dataplus._M_p,local_e88._8_8_);
  return;
}

Assistant:

void RestrictLastObjVal() {
    assert(i_current_obj_ && i_current_obj_<obj_new_.size());
    const auto& obj_last = obj_new_[i_current_obj_-1];
    auto lim = objval_last_;
    auto diff = std::max(                 // Apply degradation tolerance
        obj_new_tola_[i_current_obj_-1], std::fabs(lim) * obj_new_tolr_[i_current_obj_-1]);
    lim += diff * (obj::MAX==obj_last.obj_sense() ? -1.0 : 1.0);
    if (obj_last.HasExpr()) {
      assert(obj_last.GetQPTerms().empty());   // not mixing QP and expression term
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { lim, MPCD(Inf()) } } ) );
      else
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { MPCD(MinusInf()), lim } } ) );
    } else    if (obj_last.GetQPTerms().size()) {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						QuadConGE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						QuadConLE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
    } else {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						LinConGE{ { obj_last.GetLinTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						LinConLE{ { obj_last.GetLinTerms() }, lim } ) );
    }
  }